

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O2

void FACT_INTERNAL_GetNextWave
               (FACTCue *cue,FACTSound *sound,FACTTrack *track,FACTTrackInstance *trackInst,
               FACTEvent *evt,FACTEventInstance *evtInst)

{
  short sVar1;
  short sVar2;
  char *pcVar3;
  LinkedList *pLVar4;
  FACTWave *pFVar5;
  FACTAudioEngine *pFVar6;
  uint8_t nLoopCount;
  ushort uVar7;
  uint16_t uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint16_t *puVar12;
  ulong uVar13;
  byte *pbVar14;
  FACTWaveBank *pWaveBank;
  LinkedList **ppLVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  double dVar19;
  float fVar20;
  FAudioVoiceSends reverbSends;
  FAudioSendDescriptor reverbDesc [2];
  FAudioVoiceSends local_54;
  FAudioSendDescriptor local_48;
  undefined4 local_3c;
  FAudioSubmixVoice *local_38;
  
  if ((evt->field_3).wave.isComplex == '\0') {
    puVar12 = (uint16_t *)((long)&evt->field_3 + 8);
    pbVar14 = (byte *)((long)&evt->field_3 + 10);
    bVar16 = true;
  }
  else {
    if (((trackInst->activeWave).wave != (FACTWave *)0x0) &&
       (uVar7 = *(ushort *)((long)&evt->field_3 + 8), (uVar7 & 0xf0) != 0)) {
      uVar9 = uVar7 & 0xf;
      if (uVar9 < 2) {
        fVar18 = (float)((evtInst->field_3).valuei + 1);
        (evtInst->field_3).valuei = (uint32_t)fVar18;
        fVar20 = 0.0;
        if ((uint)fVar18 < (uint)*(ushort *)((long)&evt->field_3 + 10)) {
          fVar20 = fVar18;
        }
        (evtInst->field_3).value = fVar20;
      }
      else {
        if (uVar9 - 3 < 2) {
          fVar20 = 0.0;
          for (uVar13 = 0; *(ushort *)((long)&evt->field_3 + 10) != uVar13; uVar13 = uVar13 + 1) {
            if (uVar13 != (evtInst->field_3).valuei) {
              fVar20 = fVar20 + (float)*(byte *)(*(long *)((long)&evt->field_3 + 0x20) + uVar13);
            }
          }
          dVar19 = stb_frand();
          fVar18 = (float)dVar19 * fVar20;
          uVar11 = (ulong)*(ushort *)((long)&evt->field_3 + 10);
          do {
            bVar16 = uVar11 == 0;
            uVar11 = uVar11 - 1;
            if (bVar16) goto LAB_0010d23b;
          } while ((uVar11 == (evtInst->field_3).valuei) ||
                  (fVar20 = fVar20 - (float)*(byte *)(*(long *)((long)&evt->field_3 + 0x20) + uVar11
                                                     ), fVar18 <= fVar20));
        }
        else {
          if (uVar9 != 2) goto LAB_0010d23b;
          fVar20 = 0.0;
          for (uVar13 = 0; *(ushort *)((long)&evt->field_3 + 10) != uVar13; uVar13 = uVar13 + 1) {
            fVar20 = fVar20 + (float)*(byte *)(*(long *)((long)&evt->field_3 + 0x20) + uVar13);
          }
          dVar19 = stb_frand();
          fVar18 = (float)dVar19 * fVar20;
          uVar13 = (ulong)*(ushort *)((long)&evt->field_3 + 10);
          do {
            uVar11 = uVar13 - 1;
            if (uVar13 == 0) goto LAB_0010d23b;
            fVar20 = fVar20 - (float)*(byte *)(*(long *)((long)&evt->field_3 + 0x20) + -1 + uVar13);
            uVar13 = uVar11;
          } while (fVar18 <= fVar20);
        }
        (evtInst->field_3).valuei = (uint32_t)uVar11;
      }
    }
LAB_0010d23b:
    bVar16 = (undefined1  [72])((undefined1  [72])evt->field_3 & (undefined1  [72])0xf0) ==
             (undefined1  [72])0x0;
    pbVar14 = (byte *)(*(long *)((long)&evt->field_3 + 0x18) + (ulong)(evtInst->field_3).valuei);
    puVar12 = (uint16_t *)
              ((ulong)(evtInst->field_3).valuei * 2 + *(long *)((long)&evt->field_3 + 0x10));
  }
  uVar8 = *puVar12;
  pcVar3 = cue->parentBank->wavebankNames[*pbVar14];
  ppLVar15 = &cue->parentBank->parentEngine->wbList;
  pWaveBank = (FACTWaveBank *)0x0;
  do {
    pLVar4 = *ppLVar15;
    if (pLVar4 == (LinkedList *)0x0) break;
    pWaveBank = (FACTWaveBank *)pLVar4->entry;
    iVar10 = SDL_strcmp(pcVar3,pWaveBank->name);
    ppLVar15 = &pLVar4->next;
  } while (iVar10 != 0);
  bVar17 = false;
  nLoopCount = '\0';
  if (!(bool)(bVar16 ^ 1U | evtInst->loopCount != 0xff)) {
    bVar17 = (*(byte *)((long)&evt->field_3 + 0x45) & 0xf) == 0;
    nLoopCount = -bVar17;
  }
  FACTWaveBank_Prepare
            (pWaveBank,uVar8,(uint)(evt->field_3).wave.flags,0,nLoopCount,
             &(trackInst->upcomingWave).wave);
  pFVar5 = (trackInst->upcomingWave).wave;
  pFVar5->parentCue = cue;
  if (sound->dspCodeCount != '\0') {
    local_54.pSends = &local_48;
    local_48.Flags = 0;
    pFVar6 = cue->parentBank->parentEngine;
    local_48.pOutputVoice = pFVar6->master;
    local_3c = 0;
    local_38 = pFVar6->reverbVoice;
    local_54.SendCount = 2;
    FAudioVoice_SetOutputVoices(pFVar5->voice,&local_54);
  }
  if (cue->active3D != '\0') {
    FACTWave_SetMatrixCoefficients
              ((trackInst->upcomingWave).wave,cue->srcChannels,cue->dstChannels,
               cue->matrixCoefficients);
  }
  if ((*(byte *)((long)&evt->field_3 + 0x45) & 0x10) == 0) {
    (trackInst->upcomingWave).basePitch = sound->pitch;
  }
  else {
    dVar19 = stb_frand();
    sVar1 = (evt->field_3).wave.minPitch;
    if ((trackInst->activeWave).wave == (FACTWave *)0x0) {
LAB_0010d3af:
      sVar2 = sound->pitch;
    }
    else {
      uVar7 = (evt->field_3).wave.variationFlags;
      if ((uVar7 >> 8 & 1) == 0) goto LAB_0010d3c5;
      if ((uVar7 & 4) == 0) goto LAB_0010d3af;
      sVar2 = (trackInst->activeWave).basePitch;
    }
    (trackInst->upcomingWave).basePitch =
         (short)(int)((float)((int)(evt->field_3).wave.maxPitch - (int)sVar1) * (float)dVar19) +
         sVar1 + sVar2;
  }
LAB_0010d3c5:
  if ((*(byte *)((long)&evt->field_3 + 0x45) & 0x20) == 0) {
    fVar20 = sound->volume;
LAB_0010d420:
    fVar20 = fVar20 + track->volume;
  }
  else {
    dVar19 = stb_frand();
    fVar20 = (evt->field_3).wave.minVolume;
    fVar20 = ((evt->field_3).wave.maxVolume - fVar20) * (float)dVar19 + fVar20;
    if ((trackInst->activeWave).wave == (FACTWave *)0x0) {
LAB_0010d417:
      fVar20 = fVar20 + sound->volume;
      goto LAB_0010d420;
    }
    uVar7 = (evt->field_3).wave.variationFlags;
    if ((uVar7 >> 9 & 1) == 0) goto LAB_0010d432;
    if ((uVar7 & 1) == 0) goto LAB_0010d417;
    fVar20 = fVar20 + (trackInst->activeWave).baseVolume;
  }
  (trackInst->upcomingWave).baseVolume = fVar20;
  uVar7 = (evt->field_3).wave.variationFlags;
LAB_0010d432:
  if (uVar7 < 0x4000) {
    (trackInst->upcomingWave).baseQFactor = 1.0 / ((float)track->qfactor / 3.0);
    fVar20 = FACT_INTERNAL_CalculateFilterFrequency
                       ((float)track->frequency,
                        (cue->parentBank->parentEngine->audio->master->field_19).master.
                        inputSampleRate);
    (trackInst->upcomingWave).baseFrequency = fVar20;
    fVar20 = (trackInst->upcomingWave).baseQFactor;
    if (1.0 <= fVar20) {
      fVar20 = 1.0;
    }
    (trackInst->upcomingWave).baseQFactor = fVar20;
  }
  else {
    dVar19 = stb_frand();
    fVar20 = (evt->field_3).wave.minQFactor;
    fVar18 = 1.0 / (((evt->field_3).wave.maxQFactor - fVar20) * (float)dVar19 + fVar20);
    dVar19 = stb_frand();
    fVar20 = (evt->field_3).wave.minFrequency;
    fVar20 = FACT_INTERNAL_CalculateFilterFrequency
                       (((evt->field_3).wave.maxFrequency - fVar20) * (float)dVar19 + fVar20,
                        (cue->parentBank->parentEngine->audio->master->field_19).master.
                        inputSampleRate);
    if ((trackInst->activeWave).wave == (FACTWave *)0x0) {
      (trackInst->upcomingWave).baseQFactor = fVar18;
      (trackInst->upcomingWave).baseFrequency = fVar20;
    }
    else if ((*(byte *)((long)&evt->field_3 + 0x45) & 0xc) != 0) {
      (trackInst->upcomingWave).baseQFactor = fVar18;
      (trackInst->upcomingWave).baseFrequency = fVar20;
    }
  }
  if (bVar17) {
    uVar8 = 0;
  }
  else {
    if (evtInst->loopCount == 0) {
      return;
    }
    uVar8 = evtInst->loopCount - 1;
  }
  evtInst->loopCount = uVar8;
  return;
}

Assistant:

void FACT_INTERNAL_GetNextWave(
	FACTCue *cue,
	FACTSound *sound,
	FACTTrack *track,
	FACTTrackInstance *trackInst,
	FACTEvent *evt,
	FACTEventInstance *evtInst
) {
	FAudioSendDescriptor reverbDesc[2];
	FAudioVoiceSends reverbSends;
	const char *wbName;
	FACTWaveBank *wb = NULL;
	LinkedList *list;
	uint16_t wbTrack;
	uint8_t wbIndex;
	uint8_t loopCount = 0;
	float max, next;
	uint8_t noTrackVariation = 1;
	uint32_t i;

	/* Track Variation */
	if (evt->wave.isComplex)
	{
		if (	trackInst->activeWave.wave == NULL ||
			!(evt->wave.complex.variation & 0x00F0)	)
		{
			/* No-op, no variation on loop */
		}
		/* Ordered, Ordered From Random */
		else if (	(evt->wave.complex.variation & 0xF) == 0 ||
				(evt->wave.complex.variation & 0xF) == 1	)
		{
			evtInst->valuei += 1;
			if (evtInst->valuei >= evt->wave.complex.trackCount)
			{
				evtInst->valuei = 0;
			}
		}
		/* Random */
		else if ((evt->wave.complex.variation & 0xF) == 2)
		{
			max = 0.0f;
			for (i = 0; i < evt->wave.complex.trackCount; i += 1)
			{
				max += evt->wave.complex.weights[i];
			}
			next = FACT_INTERNAL_rng() * max;
			for (i = evt->wave.complex.trackCount; i > 0; i -= 1)
			{
				if (next > (max - evt->wave.complex.weights[i - 1]))
				{
					evtInst->valuei = i - 1;
					break;
				}
				max -= evt->wave.complex.weights[i - 1];
			}
		}
		/* Random (No Immediate Repeats), Shuffle */
		else if (	(evt->wave.complex.variation & 0xF) == 3 ||
				(evt->wave.complex.variation & 0xF) == 4	)
		{
			max = 0.0f;
			for (i = 0; i < evt->wave.complex.trackCount; i += 1)
			{
				if (i == evtInst->valuei)
				{
					continue;
				}
				max += evt->wave.complex.weights[i];
			}
			next = FACT_INTERNAL_rng() * max;
			for (i = evt->wave.complex.trackCount; i > 0; i -= 1)
			{
				if (i - 1 == evtInst->valuei)
				{
					continue;
				}
				if (next > (max - evt->wave.complex.weights[i - 1]))
				{
					evtInst->valuei = i - 1;
					break;
				}
				max -= evt->wave.complex.weights[i - 1];
			}
		}

		if (evt->wave.complex.variation & 0x00F0)
		{
			noTrackVariation = 0;
		}

		wbIndex = evt->wave.complex.wavebanks[evtInst->valuei];
		wbTrack = evt->wave.complex.tracks[evtInst->valuei];
	}
	else
	{
		wbIndex = evt->wave.simple.wavebank;
		wbTrack = evt->wave.simple.track;
	}
	wbName = cue->parentBank->wavebankNames[wbIndex];
	list = cue->parentBank->parentEngine->wbList;
	while (list != NULL)
	{
		wb = (FACTWaveBank*) list->entry;
		if (FAudio_strcmp(wbName, wb->name) == 0)
		{
			break;
		}
		list = list->next;
	}
	FAudio_assert(wb != NULL);

	/* Generate the Wave */
	if (	evtInst->loopCount == 255 &&
		noTrackVariation &&
		!(evt->wave.variationFlags & 0x0F00)	)
	{
		/* For infinite loops with no variation, let Wave do the work */
		loopCount = 255;
	}
	FACTWaveBank_Prepare(
		wb,
		wbTrack,
		evt->wave.flags,
		0,
		loopCount,
		&trackInst->upcomingWave.wave
	);
	trackInst->upcomingWave.wave->parentCue = cue;
	if (sound->dspCodeCount > 0) /* Never more than 1...? */
	{
		reverbDesc[0].Flags = 0;
		reverbDesc[0].pOutputVoice = cue->parentBank->parentEngine->master;
		reverbDesc[1].Flags = 0;
		reverbDesc[1].pOutputVoice = cue->parentBank->parentEngine->reverbVoice;
		reverbSends.SendCount = 2;
		reverbSends.pSends = reverbDesc;
		FAudioVoice_SetOutputVoices(
			trackInst->upcomingWave.wave->voice,
			&reverbSends
		);
	}

	/* 3D Audio */
	if (cue->active3D)
	{
		FACTWave_SetMatrixCoefficients(
			trackInst->upcomingWave.wave,
			cue->srcChannels,
			cue->dstChannels,
			cue->matrixCoefficients
		);
	}
	else
	{
		/* TODO: Position/Angle/UseCenterSpeaker */
	}

	/* Pitch Variation */
	if (evt->wave.variationFlags & 0x1000)
	{
		const int16_t rngPitch = (int16_t) (
			FACT_INTERNAL_rng() *
			(evt->wave.maxPitch - evt->wave.minPitch)
		) + evt->wave.minPitch;
		if (trackInst->activeWave.wave != NULL)
		{
			/* Variation on Loop */
			if (evt->wave.variationFlags & 0x0100)
			{
				/* Add/Replace */
				if (evt->wave.variationFlags & 0x0004)
				{
					trackInst->upcomingWave.basePitch =
						trackInst->activeWave.basePitch + rngPitch;
				}
				else
				{
					trackInst->upcomingWave.basePitch = rngPitch + sound->pitch;
				}
			}
		}
		else
		{
			/* Initial Pitch Variation */
			trackInst->upcomingWave.basePitch = rngPitch + sound->pitch;
		}
	}
	else
	{
		trackInst->upcomingWave.basePitch = sound->pitch;
	}

	/* Volume Variation */
	if (evt->wave.variationFlags & 0x2000)
	{
		const float rngVolume = (
			FACT_INTERNAL_rng() *
			(evt->wave.maxVolume - evt->wave.minVolume)
		) + evt->wave.minVolume;
		if (trackInst->activeWave.wave != NULL)
		{
			/* Variation on Loop */
			if (evt->wave.variationFlags & 0x0200)
			{
				/* Add/Replace */
				if (evt->wave.variationFlags & 0x0001)
				{
					trackInst->upcomingWave.baseVolume =
						trackInst->activeWave.baseVolume + rngVolume;
				}
				else
				{
					trackInst->upcomingWave.baseVolume = (
						rngVolume +
						sound->volume +
						track->volume
					);
				}
			}
		}
		else
		{
			/* Initial Volume Variation */
			trackInst->upcomingWave.baseVolume = (
				rngVolume +
				sound->volume +
				track->volume
			);
		}
	}
	else
	{
		trackInst->upcomingWave.baseVolume = sound->volume + track->volume;
	}

	/* Filter Variation, QFactor/Freq are always together */
	if (evt->wave.variationFlags & 0xC000)
	{
		const float rngQFactor = 1.0f / (
			FACT_INTERNAL_rng() *
			(evt->wave.maxQFactor - evt->wave.minQFactor) +
			evt->wave.minQFactor
		);
		const float rngFrequency = FACT_INTERNAL_CalculateFilterFrequency(
			(
				FACT_INTERNAL_rng() *
				(evt->wave.maxFrequency - evt->wave.minFrequency) +
				evt->wave.minFrequency
			),
			cue->parentBank->parentEngine->audio->master->master.inputSampleRate
		);
		if (trackInst->activeWave.wave != NULL)
		{
			/* Variation on Loop */
			if (evt->wave.variationFlags & 0x0C00)
			{
				/* TODO: Add/Replace */
				/* FIXME: Which is QFactor/Freq?
				if (evt->wave.variationFlags & 0x0010)
				{
				}
				else
				{
				}
				if (evt->wave.variationFlags & 0x0040)
				{
				}
				else
				{
				}
				*/
				trackInst->upcomingWave.baseQFactor = rngQFactor;
				trackInst->upcomingWave.baseFrequency = rngFrequency;
			}
		}
		else
		{
			/* Initial Filter Variation */
			trackInst->upcomingWave.baseQFactor = rngQFactor;
			trackInst->upcomingWave.baseFrequency = rngFrequency;
		}
	}
	else
	{
		trackInst->upcomingWave.baseQFactor = 1.0f / (track->qfactor / 3.0f);
		trackInst->upcomingWave.baseFrequency = FACT_INTERNAL_CalculateFilterFrequency(
			track->frequency,
			cue->parentBank->parentEngine->audio->master->master.inputSampleRate
		);

		/* FIXME: For some reason the 0.67 Q Factor causes problems, but it's also
		 * the only possible value until ~1 so just clamp it for now.
		 */
		trackInst->upcomingWave.baseQFactor = FAudio_min(
			trackInst->upcomingWave.baseQFactor,
			1.0f
		);
	}

	/* Try to change loop counter at the very end */
	if (loopCount == 255)
	{
		/* For infinite loops with no variation, Wave does the work */
		evtInst->loopCount = 0;
	}
	else if (evtInst->loopCount > 0)
	{
		evtInst->loopCount -= 1;
	}
}